

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<false,_true,_false>::pop_block_(DaTrie<false,_true,_false> *this)

{
  uint32_t uVar1;
  long in_RDI;
  DaTrie<false,_true,_false> *unaff_retaddr;
  uint32_t i_1;
  uint32_t i;
  uint32_t block_pos;
  undefined4 local_14;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar2;
  long lVar3;
  
  lVar3 = in_RDI;
  uVar1 = num_blocks((DaTrie<false,_true,_false> *)0x15c3e8);
  pop_block_(unaff_retaddr,(uint32_t)((ulong)lVar3 >> 0x20),
             (vector<ddd::Block,_std::allocator<ddd::Block>_> *)
             CONCAT44(uVar1 - 1,in_stack_fffffffffffffff0));
  for (uVar2 = 0; uVar2 < 0x100; uVar2 = uVar2 + 1) {
    std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::pop_back
              ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)0x15c420);
  }
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::pop_back
              ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)0x15c44d);
  }
  std::vector<ddd::Block,_std::allocator<ddd::Block>_>::pop_back
            ((vector<ddd::Block,_std::allocator<ddd::Block>_> *)0x15c468);
  *(int *)(in_RDI + 100) = *(int *)(in_RDI + 100) + -0x100;
  return;
}

Assistant:

void pop_block_() {
    assert(!bc_.empty());

    auto block_pos = num_blocks() - 1;
    pop_block_(block_pos, blocks_);

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.pop_back();
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.pop_back();
      }
    }

    blocks_.pop_back();
    bc_emps_ -= BLOCK_SIZE;
  }